

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O3

Vector3f __thiscall
pbrt::TrowbridgeReitzDistribution::Sample_wm
          (TrowbridgeReitzDistribution *this,Vector3f *wo,Point2f *u)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  Vector3f VVar3;
  Tuple3<pbrt::Vector3,_float> TVar4;
  Tuple3<pbrt::Vector3,_float> local_10;
  
  local_10.z = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  if (0.0 <= local_10.z) {
    local_10.z = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
    local_10.x = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
    local_10.y = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
    TVar4 = (Tuple3<pbrt::Vector3,_float>)
            SampleTrowbridgeReitzVisibleArea((Vector3f *)&local_10,this->alpha_x,this->alpha_y,u);
  }
  else {
    uVar1._0_4_ = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar1._4_4_ = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar2._0_8_ = uVar1 ^ 0x8000000080000000;
    auVar2._8_4_ = 0x80000000;
    auVar2._12_4_ = 0x80000000;
    local_10.z = -local_10.z;
    local_10._0_8_ = vmovlps_avx(auVar2);
    VVar3 = SampleTrowbridgeReitzVisibleArea((Vector3f *)&local_10,this->alpha_x,this->alpha_y,u);
    uVar1 = VVar3.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    TVar4.z = -VVar3.super_Tuple3<pbrt::Vector3,_float>.z;
    TVar4.x = (float)(int)uVar1;
    TVar4.y = (float)(int)(uVar1 >> 0x20);
  }
  return (Vector3f)TVar4;
}

Assistant:

PBRT_CPU_GPU
    Vector3f Sample_wm(const Vector3f &wo, const Point2f &u) const {
        bool flip = wo.z < 0;
        Vector3f wm =
            SampleTrowbridgeReitzVisibleArea(flip ? -wo : wo, alpha_x, alpha_y, u);
        if (flip)
            wm = -wm;
        return wm;
    }